

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_propagator.cpp
# Opt level: O1

void __thiscall
duckdb::StatisticsPropagator::StatisticsPropagator
          (StatisticsPropagator *this,Optimizer *optimizer_p,LogicalOperator *root_p)

{
  this->optimizer = optimizer_p;
  this->context = optimizer_p->context;
  (this->root).ptr = root_p;
  (this->statistics_map)._M_h._M_buckets = &(this->statistics_map)._M_h._M_single_bucket;
  (this->statistics_map)._M_h._M_bucket_count = 1;
  (this->statistics_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->statistics_map)._M_h._M_element_count = 0;
  (this->statistics_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->statistics_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->statistics_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->node_stats).
  super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
  super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl = (NodeStatistics *)0x0;
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid(&this->root);
  LogicalOperator::ResolveOperatorTypes((this->root).ptr);
  return;
}

Assistant:

StatisticsPropagator::StatisticsPropagator(Optimizer &optimizer_p, LogicalOperator &root_p)
    : optimizer(optimizer_p), context(optimizer.context), root(&root_p) {
	root->ResolveOperatorTypes();
}